

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_match.cpp
# Opt level: O0

void __thiscall
pfederc::Parser::parseMatchCases
          (Parser *this,bool *err,
          vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
          *cases)

{
  bool bVar1;
  Token *pTVar2;
  __tuple_element_t<0UL,_tuple<const_Token_*,_vector<const_Token_*,_allocator<const_Token_*>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  *ppTVar3;
  unique_ptr *this_00;
  bool local_51;
  undefined1 local_48 [8];
  MatchPattern matchPattern;
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  *cases_local;
  bool *err_local;
  Parser *this_local;
  
  matchPattern.
  super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .super__Head_base<0UL,_const_pfederc::Token_*,_false>._M_head_impl = (Token *)cases;
  while( true ) {
    pTVar2 = Lexer::getCurrentToken(this->lexer);
    bVar1 = Token::operator!=(pTVar2,TOK_STMT);
    local_51 = false;
    if (bVar1) {
      pTVar2 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator!=(pTVar2,TOK_EOF);
      local_51 = false;
      if (bVar1) {
        pTVar2 = Lexer::getCurrentToken(this->lexer);
        local_51 = Token::operator!=(pTVar2,TOK_ANY);
      }
    }
    if (local_51 == false) break;
    skipEol(this);
    parseMatchCase((MatchPattern *)local_48,this,err);
    ppTVar3 = std::
              get<0ul,pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                        ((tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                          *)local_48);
    if (*ppTVar3 !=
        (__tuple_element_t<0UL,_tuple<const_Token_*,_vector<const_Token_*,_allocator<const_Token_*>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
         )0x0) {
      this_00 = (unique_ptr *)
                std::
                get<2ul,pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                          ((tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                            *)local_48);
      bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
      if (bVar1) {
        std::
        vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
        ::push_back((vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                     *)matchPattern.
                       super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                       .super__Head_base<0UL,_const_pfederc::Token_*,_false>._M_head_impl,
                    (value_type *)local_48);
      }
    }
    std::
    tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
    ::~tuple((tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
              *)local_48);
  }
  return;
}

Assistant:

void Parser::parseMatchCases(bool &err,
    std::vector<MatchPattern> &cases) noexcept {

  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF
      && *lexer.getCurrentToken() != TokenType::TOK_ANY) {
    skipEol();

    MatchPattern matchPattern = parseMatchCase(err);
    if (std::get<0>(matchPattern) && std::get<2>(matchPattern))
      cases.push_back(std::move(matchPattern));
  }
}